

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

vector<LogCategory,_std::allocator<LogCategory>_> * __thiscall
BCLog::Logger::LogCategoriesList(Logger *this)

{
  long lVar1;
  bool bVar2;
  _Self *in_RSI;
  Logger *in_RDI;
  long in_FS_OFFSET;
  type *flag;
  type *category;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
  *__range1;
  vector<LogCategory,_std::allocator<LogCategory>_> *ret;
  const_iterator __end1;
  const_iterator __begin1;
  LogCategory *in_stack_ffffffffffffff58;
  Logger *this_00;
  size_type in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::vector<LogCategory,_std::allocator<LogCategory>_>::vector
            ((vector<LogCategory,_std::allocator<LogCategory>_> *)in_stack_ffffffffffffff58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
          *)in_stack_ffffffffffffff58);
  std::vector<LogCategory,_std::allocator<LogCategory>_>::reserve
            ((vector<LogCategory,_std::allocator<LogCategory>_> *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
           *)in_RDI);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
         *)in_RDI);
  while (bVar2 = std::operator==(in_RSI,(_Self *)in_RDI), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>
                 *)in_stack_ffffffffffffff58);
    std::get<0ul,std::__cxx11::string_const,BCLog::LogFlags>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>
                *)in_stack_ffffffffffffff58);
    std::get<1ul,std::__cxx11::string_const,BCLog::LogFlags>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>
                *)in_stack_ffffffffffffff58);
    std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    WillLogCategory(this_00,(LogFlags)in_RSI);
    std::vector<LogCategory,_std::allocator<LogCategory>_>::push_back
              ((vector<LogCategory,_std::allocator<LogCategory>_> *)in_stack_ffffffffffffff58,
               (value_type *)0x3abe20);
    LogCategory::~LogCategory(in_stack_ffffffffffffff58);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>
                  *)in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<LogCategory,_std::allocator<LogCategory>_> *)in_RDI;
}

Assistant:

std::vector<LogCategory> BCLog::Logger::LogCategoriesList() const
{
    std::vector<LogCategory> ret;
    ret.reserve(LOG_CATEGORIES_BY_STR.size());
    for (const auto& [category, flag] : LOG_CATEGORIES_BY_STR) {
        ret.push_back(LogCategory{.category = category, .active = WillLogCategory(flag)});
    }
    return ret;
}